

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

param_configuration * nonius::detail::parser<nonius::param_configuration>::parse(string *param)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>
  iVar1;
  _Ios_Openmode _Var2;
  size_type sVar3;
  reference pvVar4;
  param_registry *this;
  param_configuration *in_RDI;
  out_of_range *anon_var_0;
  size_t count;
  stringstream ss;
  param step;
  param init;
  value_type oper;
  mapped_type def;
  value_type name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  run_configuration *in_stack_fffffffffffffc18;
  optional<nonius::run_configuration> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
  *in_stack_fffffffffffffc30;
  iterator in_stack_fffffffffffffc38;
  size_type in_stack_fffffffffffffc40;
  allocator_type *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc68;
  undefined1 ****local_378;
  is_any_ofF *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcf0;
  string local_300 [64];
  ulong local_2c0;
  ulong local_2b8;
  long local_2b0 [16];
  string *in_stack_fffffffffffffdd0;
  param *in_stack_fffffffffffffdd8;
  string local_108 [32];
  int local_e8;
  key_equal local_e4 [3];
  undefined1 local_e1;
  undefined8 ***local_d0;
  undefined1 ***local_c8 [6];
  undefined8 ***local_98;
  undefined8 local_90;
  string local_78 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x211a7e);
  is_any_of(in_stack_fffffffffffffc68);
  split<nonius::detail::is_any_ofF>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  is_any_ofF::~is_any_ofF((is_any_ofF *)0x211ad0);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar3 != 0) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_28,0);
    std::__cxx11::string::string(local_78,(string *)pvVar4);
    this = global_param_registry();
    param_registry::defaults(this);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
          *)in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->name);
    nonius::param::param((param *)in_stack_fffffffffffffc20,(param *)in_stack_fffffffffffffc18);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_28);
    if (sVar3 == 2) {
      local_e1 = 1;
      local_d0 = local_c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_28,1);
      nonius::param::parse(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nonius::param,_true>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                 (param *)in_stack_fffffffffffffc20);
      local_e1 = 0;
      local_98 = local_c8;
      local_90 = 1;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>
                   *)0x211c24);
      iVar1._M_len = in_stack_fffffffffffffc40;
      iVar1._M_array = in_stack_fffffffffffffc38;
      parameters::unordered_map
                ((parameters *)in_stack_fffffffffffffc30,iVar1,(size_type)in_stack_fffffffffffffc28,
                 (hasher *)in_stack_fffffffffffffc20,local_e4,in_stack_fffffffffffffc50);
      optional<nonius::run_configuration>::optional(&in_RDI->run);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>
                    *)0x211c82);
      local_378 = (undefined1 ****)&local_98;
      do {
        local_378 = local_378 + -6;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
                 *)in_stack_fffffffffffffc20);
      } while (local_378 != local_c8);
      nonius::param::~param((param *)0x211ccc);
      local_e8 = 1;
    }
    else {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_28);
      if (sVar3 == 5) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_28,1);
        std::__cxx11::string::string(local_108,(string *)pvVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_28,2);
        nonius::param::parse(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_28,3);
        nonius::param::parse(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_28,4);
        _Var2 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)local_2b0,(string *)pvVar4,_Var2);
        local_2b8 = 0;
        std::istream::operator>>(local_2b0,&local_2b8);
        std::ios::exceptions((int)local_2b0 + (int)*(undefined8 *)(local_2b0[0] + -0x18));
        *(undefined8 *)
         &(in_RDI->map).
          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
          ._M_h._M_rehash_policy = 0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_next_resize = 0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_element_count = 0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_buckets = (__buckets_ptr)0x0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_bucket_count = 0;
        (in_RDI->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)0x0;
        parameters::parameters((parameters *)0x211fab);
        in_stack_fffffffffffffc30 =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
              *)&in_RDI->run;
        std::__cxx11::string::string((string *)&stack0xfffffffffffffce0,local_78);
        std::__cxx11::string::string(local_300,local_108);
        nonius::param::param((param *)in_stack_fffffffffffffc20,(param *)in_stack_fffffffffffffc18);
        nonius::param::param((param *)in_stack_fffffffffffffc20,(param *)in_stack_fffffffffffffc18);
        local_2c0 = local_2b8;
        optional<nonius::run_configuration>::optional
                  (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        run_configuration::~run_configuration((run_configuration *)in_stack_fffffffffffffc20);
        local_e8 = 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
        nonius::param::~param((param *)0x21207f);
        nonius::param::~param((param *)0x21208c);
        std::__cxx11::string::~string(local_108);
      }
      else {
        local_e8 = 0;
      }
    }
    nonius::param::~param((param *)0x2121d7);
    std::__cxx11::string::~string(local_78);
    if (local_e8 != 0) goto LAB_002122b3;
  }
  *(undefined8 *)
   &(in_RDI->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_rehash_policy = 0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_element_count = 0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_bucket_count = 0;
  (in_RDI->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  parameters::parameters((parameters *)0x212271);
  optional<nonius::run_configuration>::optional(&in_RDI->run);
  local_e8 = 1;
LAB_002122b3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc30);
  return in_RDI;
}

Assistant:

static param_configuration parse(std::string const& param) {
                auto v = std::vector<std::string>{};
                split(v, param, is_any_of(":"));
                try {
                    if (v.size() > 0) {
                        auto name = v[0];
                        auto def  = global_param_registry().defaults().at(name);
                        if (v.size() == 2)
                            return {{{name, def.parse(v[1])}}, {}};
                        else if (v.size() == 5) {
                            auto oper  = v[1];
                            auto init  = def.parse(v[2]);
                            auto step  = def.parse(v[3]);
                            std::stringstream ss(v[4]);
                            auto count = size_t();
                            ss >> count;
                            ss.exceptions(std::ios::failbit);
                            return {{}, run_configuration{name, oper, init, step, count}};
                        }
                    }
                }
                catch (std::out_of_range const&) {}
                return {};
            }